

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O2

shared_ptr<duckdb::ClientContextWrapper,_true> * __thiscall
duckdb::shared_ptr<duckdb::ClientContextWrapper,_true>::operator=
          (shared_ptr<duckdb::ClientContextWrapper,_true> *this,
          shared_ptr<duckdb::ClientContextWrapper,_true> *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  peVar1 = (other->internal).
           super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (other->internal).
           super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (other->internal).super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (other->internal).super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_10._M_pi =
       (this->internal).super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (this->internal).super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (this->internal).super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return this;
}

Assistant:

shared_ptr<T> &operator=(shared_ptr &&other) noexcept {
		// Create a new shared_ptr using the move constructor, then swap out the ownership to *this
		shared_ptr(std::move(other)).swap(*this);
		return *this;
	}